

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

MAP_RESULT Map_ContainsValue(MAP_HANDLE handle,char *value,_Bool *valueExists)

{
  LOGGER_LOG p_Var1;
  char *pcVar2;
  char **ppcVar3;
  MAP_HANDLE_DATA *handleData;
  LOGGER_LOG l;
  MAP_RESULT result;
  _Bool *valueExists_local;
  char *value_local;
  MAP_HANDLE handle_local;
  
  if (((handle == (MAP_HANDLE)0x0) || (value == (char *)0x0)) || (valueExists == (_Bool *)0x0)) {
    l._4_4_ = MAP_INVALIDARG;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      pcVar2 = MAP_RESULTStrings(MAP_INVALIDARG);
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/map.c"
                ,"Map_ContainsValue",0x213,1,"result = %s%s (%d)","",pcVar2,3);
    }
  }
  else {
    ppcVar3 = findValue(handle,value);
    *valueExists = ppcVar3 != (char **)0x0;
    l._4_4_ = MAP_OK;
  }
  return l._4_4_;
}

Assistant:

MAP_RESULT Map_ContainsValue(MAP_HANDLE handle, const char* value, bool* valueExists)
{
    MAP_RESULT result;
    /*Codes_SRS_MAP_02_027: [If parameter handle, value or valueExists is NULL then Map_ContainsValue shall return MAP_INVALIDARG.] */
    if (
        (handle == NULL) ||
        (value == NULL) ||
        (valueExists == NULL)
        )
    {
        result = MAP_INVALIDARG;
        LOG_MAP_ERROR;
    }
    else
    {
        MAP_HANDLE_DATA* handleData = (MAP_HANDLE_DATA*)handle;
        /*Codes_SRS_MAP_02_028: [Otherwise, if a pair <key, value> has its value equal to the parameter value, the Map_ContainsValue shall return MAP_OK and shall write in valueExists "true".]*/
        /*Codes_SRS_MAP_02_029: [Otherwise, if such a <key, value> does not exist, then Map_ContainsValue shall return MAP_OK and shall write in valueExists "false".] */
        *valueExists = (findValue(handleData, value) != NULL) ? true : false;
        result = MAP_OK;
    }
    return result;
}